

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

void __thiscall Qentem::Value<wchar_t>::operator+=(Value<wchar_t> *this,ObjectT *obj)

{
  anon_union_16_5_5c8fea6c_for_Value<wchar_t>_1 local_30;
  undefined1 local_20;
  
  if (this->type_ != Array) {
    if (this->type_ == Object) {
      HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::operator+=
                ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)this,obj);
      return;
    }
    reset(this);
    this->type_ = Array;
  }
  local_30.array_.storage_ =
       (Value<wchar_t> *)
       (obj->
       super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
       ).hashTable_;
  local_30._8_4_ =
       (obj->
       super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
       ).index_;
  local_30._12_4_ =
       (obj->
       super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
       ).capacity_;
  (obj->
  super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
  ).hashTable_ = (SizeT *)0x0;
  (obj->
  super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
  ).index_ = 0;
  (obj->
  super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
  ).capacity_ = 0;
  local_20 = 2;
  Array<Qentem::Value<wchar_t>_>::operator+=
            ((Array<Qentem::Value<wchar_t>_> *)this,(Value<wchar_t> *)&local_30.array_);
  ~Value((Value<wchar_t> *)&local_30.array_);
  return;
}

Assistant:

inline void operator+=(ObjectT &&obj) {
        if (isObject()) {
            object_ += Memory::Move(obj);
        } else {
            if (!isArray()) {
                reset();
                setTypeToArray();
            }

            array_ += Value{Memory::Move(obj)};
        }
    }